

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O0

mz_bool mz_zip_locate_file_binary_search(mz_zip_archive *pZip,char *pFilename,mz_uint32 *pIndex)

{
  uint uVar1;
  uint uVar2;
  mz_zip_internal_state *pmVar3;
  void *pvVar4;
  void *pvVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  ulong uVar9;
  mz_uint8 *pmVar10;
  int local_d4;
  uint local_c4;
  int comp;
  mz_uint32 file_index;
  mz_int64 m;
  mz_int64 h;
  mz_int64 l;
  mz_uint filename_len;
  mz_uint32 size;
  mz_uint32 *pIndices;
  mz_zip_array *pCentral_dir;
  mz_zip_array *pCentral_dir_offsets;
  mz_zip_internal_state *pState;
  mz_uint32 *pIndex_local;
  char *pFilename_local;
  mz_zip_archive *pZip_local;
  byte local_46;
  byte local_45;
  mz_uint8 r;
  mz_uint8 l_1;
  mz_uint l_len;
  mz_uint8 *pE;
  mz_uint8 *pL;
  byte *local_28;
  
  pmVar3 = pZip->m_pState;
  pvVar4 = (pmVar3->m_sorted_central_dir_offsets).m_p;
  uVar1 = pZip->m_total_files;
  sVar8 = strlen(pFilename);
  uVar6 = (uint)sVar8;
  if (pIndex != (mz_uint32 *)0x0) {
    *pIndex = 0;
  }
  if (uVar1 != 0) {
    h = 0;
    m = (ulong)uVar1 - 1;
    while (h <= m) {
      uVar9 = h + (m - h >> 1);
      uVar1 = *(uint *)((long)pvVar4 + (uVar9 & 0xffffffff) * 4);
      pvVar5 = (pmVar3->m_central_dir).m_p;
      uVar2 = *(uint *)((long)(pmVar3->m_central_dir_offsets).m_p + (ulong)uVar1 * 4);
      uVar7 = (uint)*(ushort *)((long)pvVar5 + (ulong)uVar2 + 0x1c);
      local_45 = 0;
      local_46 = 0;
      pE = (mz_uint8 *)((long)pvVar5 + (ulong)uVar2 + 0x2e);
      local_c4 = uVar6;
      if (uVar7 < uVar6) {
        local_c4 = uVar7;
      }
      pmVar10 = pE + local_c4;
      local_28 = (byte *)pFilename;
      for (; pE < pmVar10; pE = pE + 1) {
        if ((*pE < 0x41) || (0x5a < *pE)) {
          local_45 = *pE;
        }
        else {
          local_45 = *pE + 0x20;
        }
        if (((char)*local_28 < 'A') || ('Z' < (char)*local_28)) {
          local_46 = *local_28;
        }
        else {
          local_46 = *local_28 + 0x20;
        }
        if (local_45 != local_46) break;
        local_28 = local_28 + 1;
      }
      if (pE == pmVar10) {
        local_d4 = uVar7 - uVar6;
      }
      else {
        local_d4 = (uint)local_45 - (uint)local_46;
      }
      if (local_d4 == 0) {
        if (pIndex != (mz_uint32 *)0x0) {
          *pIndex = uVar1;
        }
        return 1;
      }
      if (local_d4 < 0) {
        h = uVar9 + 1;
      }
      else {
        m = uVar9 - 1;
      }
    }
  }
  if (pZip != (mz_zip_archive *)0x0) {
    pZip->m_last_error = MZ_ZIP_FILE_NOT_FOUND;
  }
  return 0;
}

Assistant:

static mz_bool mz_zip_locate_file_binary_search(mz_zip_archive *pZip,
                                                const char *pFilename,
                                                mz_uint32 *pIndex) {
  mz_zip_internal_state *pState = pZip->m_pState;
  const mz_zip_array *pCentral_dir_offsets = &pState->m_central_dir_offsets;
  const mz_zip_array *pCentral_dir = &pState->m_central_dir;
  mz_uint32 *pIndices = &MZ_ZIP_ARRAY_ELEMENT(
      &pState->m_sorted_central_dir_offsets, mz_uint32, 0);
  const mz_uint32 size = pZip->m_total_files;
  const mz_uint filename_len = (mz_uint)strlen(pFilename);

  if (pIndex)
    *pIndex = 0;

  if (size) {
    /* yes I could use uint32_t's, but then we would have to add some special
     * case checks in the loop, argh, and */
    /* honestly the major expense here on 32-bit CPU's will still be the
     * filename compare */
    mz_int64 l = 0, h = (mz_int64)size - 1;

    while (l <= h) {
      mz_int64 m = l + ((h - l) >> 1);
      mz_uint32 file_index = pIndices[(mz_uint32)m];

      int comp = mz_zip_filename_compare(pCentral_dir, pCentral_dir_offsets,
                                         file_index, pFilename, filename_len);
      if (!comp) {
        if (pIndex)
          *pIndex = file_index;
        return MZ_TRUE;
      } else if (comp < 0)
        l = m + 1;
      else
        h = m - 1;
    }
  }

  return mz_zip_set_error(pZip, MZ_ZIP_FILE_NOT_FOUND);
}